

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstrum_to_mel_generalized_cepstrum.h
# Opt level: O3

void __thiscall
sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::
~MelGeneralizedCepstrumToMelGeneralizedCepstrum
          (MelGeneralizedCepstrumToMelGeneralizedCepstrum *this)

{
  ~MelGeneralizedCepstrumToMelGeneralizedCepstrum(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~MelGeneralizedCepstrumToMelGeneralizedCepstrum() {
    for (std::vector<MelGeneralizedCepstrumToMelGeneralizedCepstrum::
                         ModuleInterface*>::iterator itr(modules_.begin());
         itr != modules_.end(); ++itr) {
      delete (*itr);
    }
  }